

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

_Ios_Openmode
cs_impl::try_convert_and_check<std::_Ios_Openmode,_std::_Ios_Openmode,_std::_Ios_Openmode,_1UL>::
convert(var *val)

{
  bool bVar1;
  _Ios_Openmode *p_Var2;
  string *str;
  char *in_stack_00000338;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  undefined1 uVar3;
  type_info *in_stack_fffffffffffffee8;
  type_info *in_stack_fffffffffffffef0;
  any *in_stack_ffffffffffffff10;
  any *in_stack_ffffffffffffff18;
  
  any::type((any *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  bVar1 = std::type_info::operator==(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if (!bVar1) {
    uVar3 = 1;
    str = (string *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff18);
    std::operator+((char *)in_stack_fffffffffffffee8,
                   (any *)CONCAT17(uVar3,in_stack_fffffffffffffee0));
    std::operator+((any *)in_stack_fffffffffffffee8,
                   (char *)CONCAT17(uVar3,in_stack_fffffffffffffee0));
    get_name_of_type<std::_Ios_Openmode>();
    cxx_demangle_abi_cxx11_(in_stack_00000338);
    std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    std::operator+((any *)in_stack_fffffffffffffee8,
                   (char *)CONCAT17(uVar3,in_stack_fffffffffffffee0));
    any::get_type_name_abi_cxx11_((any *)in_stack_fffffffffffffee8);
    std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    cs::runtime_error::runtime_error((runtime_error *)CONCAT17(uVar3,in_stack_fffffffffffffee0),str)
    ;
    __cxa_throw(str,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
  p_Var2 = convert_helper<std::_Ios_Openmode>::get_val((any *)0x28651e);
  return *p_Var2;
}

Assistant:

inline static _TargetT convert(cs::var &val)
		{
			if (val.type() == typeid(_TargetT))
				return convert_helper<_TargetT>::get_val(val);
			else
				throw cs::runtime_error("Invalid Argument. At " + std::to_string(index + 1) + ". Expected " +
				                        cxx_demangle(get_name_of_type<_TargetT>()) + ", provided " +
				                        val.get_type_name());
		}